

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_complex<std::complex<double>>
          (App *this,string *name,complex<double> *variable,string *description,bool defaulted,
          string *label)

{
  reference pvVar1;
  Option *pOVar2;
  string local_318;
  stringstream local_2f8 [8];
  stringstream out;
  ostream local_2e8 [376];
  string local_170;
  string local_150;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_130;
  string local_110;
  Option *local_f0;
  Option *opt;
  string local_e0 [32];
  string local_c0 [32];
  undefined1 local_a0 [8];
  callback_t fun;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  string local_58 [8];
  string simple_name;
  string *label_local;
  bool defaulted_local;
  string *description_local;
  complex<double> *variable_local;
  string *name_local;
  App *this_local;
  
  simple_name.field_2._8_8_ = label;
  detail::split(&local_70,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_70,0);
  ::std::__cxx11::string::string(local_58,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  opt = (Option *)variable;
  ::std::__cxx11::string::string(local_e0,local_58);
  ::std::__cxx11::string::string(local_c0,(string *)label);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_complex<std::complex<double>>(std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_a0,(anon_class_72_3_15b80c14 *)&opt);
  add_complex<std::complex<double>>(std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &opt);
  ::std::__cxx11::string::string((string *)&local_110,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_130,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_a0);
  ::std::__cxx11::string::string((string *)&local_150,(string *)description);
  pOVar2 = add_option(this,&local_110,&local_130,&local_150,defaulted);
  ::std::__cxx11::string::~string((string *)&local_150);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_130);
  ::std::__cxx11::string::~string((string *)&local_110);
  local_f0 = pOVar2;
  ::std::__cxx11::string::string((string *)&local_170,(string *)label);
  Option::set_custom_option(pOVar2,&local_170,2);
  ::std::__cxx11::string::~string((string *)&local_170);
  if (defaulted) {
    ::std::__cxx11::stringstream::stringstream(local_2f8);
    ::std::operator<<(local_2e8,(complex *)variable);
    pOVar2 = local_f0;
    ::std::__cxx11::stringstream::str();
    Option::set_default_str(pOVar2,&local_318);
    ::std::__cxx11::string::~string((string *)&local_318);
    ::std::__cxx11::stringstream::~stringstream(local_2f8);
  }
  pOVar2 = local_f0;
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)local_a0);
  ::std::__cxx11::string::~string(local_58);
  return pOVar2;
}

Assistant:

Option *add_complex(std::string name,
                        T &variable,
                        std::string description = "",
                        bool defaulted = false,
                        std::string label = "COMPLEX") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&variable, simple_name, label](results_t res) {
            double x, y;
            bool worked = detail::lexical_cast(res[0], x) && detail::lexical_cast(res[1], y);
            if(worked)
                variable = T(x, y);
            return worked;
        };

        CLI::Option *opt = add_option(name, fun, description, defaulted);
        opt->set_custom_option(label, 2);
        if(defaulted) {
            std::stringstream out;
            out << variable;
            opt->set_default_str(out.str());
        }
        return opt;
    }